

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::PortConnection::PortConnection(PortConnection *this,Symbol *port)

{
  this->port = port;
  this->useDefault = false;
  this->isImplicit = false;
  this->connectedSymbol = (Symbol *)0x0;
  this->expr = (Expression *)0x0;
  this->modport = (ModportSymbol *)0x0;
  (this->field_4).exprSyntax = (ExpressionSyntax *)0x0;
  return;
}

Assistant:

PortConnection::PortConnection(const Symbol& port) : port(port) {
}